

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O3

void __thiscall OStream_LargeSpan_Test::TestBody(OStream_LargeSpan_Test *this)

{
  first_elements_are pred;
  first_elements_are pred_00;
  first_elements_are pred_01;
  InSequence seq;
  array<const_char,_7UL> v;
  test_ostream str;
  undefined8 in_stack_fffffffffffffe48;
  _Alloc_hider in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  MatcherBase<unsigned_long> local_190;
  undefined2 *local_178;
  undefined8 local_170;
  undefined2 local_168;
  undefined2 uStack_166;
  undefined4 uStack_164;
  MatcherBase<const_std::vector<char,_std::allocator<char>_>_&> local_158;
  undefined4 local_140;
  undefined3 uStack_13c;
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> local_138;
  testing *local_100 [2];
  long local_f0 [2];
  testing *local_e0 [2];
  long local_d0 [2];
  testing *local_c0 [2];
  long local_b0 [2];
  test_ostream local_a0;
  
  uStack_13c = 0x676665;
  local_140 = 0x64636261;
  anon_unknown.dwarf_16892c::test_ostream::test_ostream(&local_a0);
  testing::InSequence::InSequence((InSequence *)&stack0xfffffffffffffe4f);
  local_168 = 0x6261;
  uStack_166 = 99;
  local_170 = 3;
  local_178 = &local_168;
  local_c0[0] = (testing *)local_b0;
  std::__cxx11::string::_M_construct<char*>((string *)local_c0,&local_168,(long)&uStack_166 + 1);
  pred.expected_._M_string_length = (size_type)in_stack_fffffffffffffe50._M_p;
  pred.expected_._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  pred.expected_.field_2._M_allocated_capacity = in_stack_fffffffffffffe58;
  pred.expected_.field_2._8_8_ = in_stack_fffffffffffffe60;
  testing::Truly<(anonymous_namespace)::first_elements_are>
            ((PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
              *)&stack0xfffffffffffffe50,local_c0[0],pred);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (PolymorphicMatcher *)in_stack_fffffffffffffe50._M_p);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_190,3);
  anon_unknown.dwarf_16892c::test_ostream::gmock_flush_buffer
            (&local_138,&local_a0,
             (Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (Matcher<unsigned_long> *)&local_190);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(&local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xae,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"abc\"s}), test_ostream::buffer_size)"
                    );
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            ((MatcherBase<const_std::vector<char,_std::allocator<char>_>_&> *)
             &local_138.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
              .
              super__Head_base<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_false>
            );
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_138.matchers_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_190);
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            (&local_158);
  if ((PolymorphicMatcher *)in_stack_fffffffffffffe50._M_p !=
      (PolymorphicMatcher *)&stack0xfffffffffffffe60) {
    operator_delete(in_stack_fffffffffffffe50._M_p,in_stack_fffffffffffffe60 + 1);
  }
  if (local_c0[0] != (testing *)local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT44(uStack_164,CONCAT22(uStack_166,local_168)) + 1);
  }
  local_168 = 0x6564;
  uStack_166 = 0x66;
  local_170 = 3;
  local_178 = &local_168;
  local_e0[0] = (testing *)local_d0;
  std::__cxx11::string::_M_construct<char*>((string *)local_e0,&local_168);
  pred_00.expected_._M_string_length = (size_type)in_stack_fffffffffffffe50._M_p;
  pred_00.expected_._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  pred_00.expected_.field_2._M_allocated_capacity = in_stack_fffffffffffffe58;
  pred_00.expected_.field_2._8_8_ = in_stack_fffffffffffffe60;
  testing::Truly<(anonymous_namespace)::first_elements_are>
            ((PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
              *)&stack0xfffffffffffffe50,local_e0[0],pred_00);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (PolymorphicMatcher *)in_stack_fffffffffffffe50._M_p);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_190,3);
  anon_unknown.dwarf_16892c::test_ostream::gmock_flush_buffer
            (&local_138,&local_a0,
             (Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (Matcher<unsigned_long> *)&local_190);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(&local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xb0,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"def\"s}), test_ostream::buffer_size)"
                    );
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            ((MatcherBase<const_std::vector<char,_std::allocator<char>_>_&> *)
             &local_138.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
              .
              super__Head_base<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_false>
            );
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_138.matchers_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_190);
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            (&local_158);
  if ((PolymorphicMatcher *)in_stack_fffffffffffffe50._M_p !=
      (PolymorphicMatcher *)&stack0xfffffffffffffe60) {
    operator_delete(in_stack_fffffffffffffe50._M_p,in_stack_fffffffffffffe60 + 1);
  }
  if (local_e0[0] != (testing *)local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT44(uStack_164,CONCAT22(uStack_166,local_168)) + 1);
  }
  local_168 = 0x67;
  local_170 = 1;
  local_178 = &local_168;
  local_100[0] = (testing *)local_f0;
  std::__cxx11::string::_M_construct<char*>((string *)local_100,&local_168);
  pred_01.expected_._M_string_length = (size_type)in_stack_fffffffffffffe50._M_p;
  pred_01.expected_._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  pred_01.expected_.field_2._M_allocated_capacity = in_stack_fffffffffffffe58;
  pred_01.expected_.field_2._8_8_ = in_stack_fffffffffffffe60;
  testing::Truly<(anonymous_namespace)::first_elements_are>
            ((PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
              *)&stack0xfffffffffffffe50,local_100[0],pred_01);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (PolymorphicMatcher *)in_stack_fffffffffffffe50._M_p);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_190,1);
  anon_unknown.dwarf_16892c::test_ostream::gmock_flush_buffer
            (&local_138,&local_a0,
             (Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_158,
             (Matcher<unsigned_long> *)&local_190);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(&local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xb1,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"g\"s}), std::size_t{1})");
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            ((MatcherBase<const_std::vector<char,_std::allocator<char>_>_&> *)
             &local_138.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
              .
              super__Head_base<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_false>
            );
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_138.matchers_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_190);
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            (&local_158);
  if ((PolymorphicMatcher *)in_stack_fffffffffffffe50._M_p !=
      (PolymorphicMatcher *)&stack0xfffffffffffffe60) {
    operator_delete(in_stack_fffffffffffffe50._M_p,in_stack_fffffffffffffe60 + 1);
  }
  if (local_100[0] != (testing *)local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT44(uStack_164,CONCAT22(uStack_166,local_168)) + 1);
  }
  pstore::exchange::export_ns::ostream_base::write<7l>
            (&local_a0.super_ostream_base,(span<const_char,_7L>)&local_140);
  pstore::exchange::export_ns::ostream_base::flush(&local_a0.super_ostream_base);
  testing::InSequence::~InSequence((InSequence *)&stack0xfffffffffffffe4f);
  local_a0.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__test_ostream_002352c0;
  testing::internal::
  FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  ~FunctionMocker(&local_a0.gmock02_flush_buffer_96);
  pstore::exchange::export_ns::ostream_base::~ostream_base(&local_a0.super_ostream_base);
  return;
}

Assistant:

TEST (OStream, LargeSpan) {
    std::array<char const, 7U> const v{{'a', 'b', 'c', 'd', 'e', 'f', 'g'}};

    test_ostream str;

    // TODO: here the code could optimize the case where more than a buffer's worth of data is
    // being written.
    testing::InSequence seq;
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"abc"s}), test_ostream::buffer_size));
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"def"s}), test_ostream::buffer_size));
    EXPECT_CALL (str, flush_buffer (testing::Truly (first_elements_are{"g"s}), std::size_t{1}));

    str.write (pstore::gsl::make_span (v));
    str.flush ();
}